

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O3

void __thiscall
Diligent::FramebufferCache::OnDestroyRenderPass(FramebufferCache *this,VkRenderPass Pass)

{
  unordered_multimap<VkImageView_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkImageView_T_*>,_std::equal_to<VkImageView_T_*>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
  *this_00;
  VkRenderPass pVVar1;
  int iVar2;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
  _Var3;
  iterator __it;
  _Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
  _Var4;
  const_iterator __last;
  ulong uVar5;
  pair<std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>,_std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>_>
  pVar6;
  pair<std::__detail::_Node_iterator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>,_std::__detail::_Node_iterator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>_>
  pVar7;
  key_type local_68;
  pthread_mutex_t *local_60;
  const_iterator local_58;
  FramebufferCache *local_50;
  _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_48;
  VkRenderPass local_40;
  _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *local_38;
  
  local_60 = (pthread_mutex_t *)&this->m_Mutex;
  local_40 = Pass;
  iVar2 = pthread_mutex_lock(local_60);
  if (iVar2 == 0) {
    local_38 = &(this->m_RenderPassToKeyMap)._M_h;
    local_50 = this;
    pVar6 = std::
            _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(local_38,&local_40);
    __last.
    super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
               )pVar6.second.
                super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                ._M_cur;
    _Var3._M_cur = (__node_type *)
                   pVar6.first.
                   super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                   ._M_cur;
    local_58.
    super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
               )(_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                 )_Var3._M_cur;
    if ((_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
         )_Var3._M_cur !=
        __last.
        super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
        ._M_cur) {
      local_48 = &(local_50->m_Cache)._M_h;
      this_00 = &local_50->m_ViewToKeyMap;
      do {
        __it = std::
               _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(local_48,(key_type *)
                               ((long)&((_Var3._M_cur)->
                                       super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                                       ._M_storage._M_storage + 8));
        if (__it.
            super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
          ::
          SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,void>
                    ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                      *)local_50->m_DeviceVk,
                     (VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>
                      *)((long)__it.
                               super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                               ._M_cur + 0x78),
                     *(Uint64 *)
                      ((long)&((_Var3._M_cur)->
                              super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                              ._M_storage._M_storage + 0x68));
          std::
          _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::erase(local_48,(const_iterator)
                           __it.
                           super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                           ._M_cur);
        }
        pVVar1 = local_40;
        if (*(int *)((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                            ._M_storage._M_storage + 0x10) != 0) {
          uVar5 = 0;
          do {
            local_68 = *(key_type *)
                        ((long)&((_Var3._M_cur)->
                                super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                                ._M_storage._M_storage + uVar5 * 8 + 0x20);
            if (local_68 != (key_type)0x0) {
              pVar7 = std::
                      _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      ::equal_range(&this_00->_M_h,&local_68);
              _Var4._M_cur = (__node_type *)
                             pVar7.first.
                             super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                             ._M_cur;
              while (_Var4._M_cur !=
                     (__node_type *)
                     pVar7.second.
                     super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                     ._M_cur) {
                if (*(VkRenderPass *)((long)_Var4._M_cur + 0x10) == pVVar1) {
                  _Var4._M_cur = (__node_type *)
                                 std::
                                 _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                                 ::erase(&this_00->_M_h,_Var4._M_cur);
                }
                else {
                  _Var4._M_cur = *_Var4._M_cur;
                }
              }
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)((long)&((_Var3._M_cur)->
                                            super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                                            ._M_storage._M_storage + 0x10));
        }
        local_68 = *(key_type *)
                    ((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                            ._M_storage._M_storage + 0x18);
        if (local_68 != (key_type)0x0) {
          pVar7 = std::
                  _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  ::equal_range(&this_00->_M_h,&local_68);
          _Var4._M_cur = (__node_type *)
                         pVar7.first.
                         super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                         ._M_cur;
          while (_Var4._M_cur !=
                 (__node_type *)
                 pVar7.second.
                 super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                 ._M_cur) {
            if (*(VkRenderPass *)((long)_Var4._M_cur + 0x10) == pVVar1) {
              _Var4._M_cur = (__node_type *)
                             std::
                             _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                             ::erase(&this_00->_M_h,_Var4._M_cur);
            }
            else {
              _Var4._M_cur = *_Var4._M_cur;
            }
          }
        }
        local_68 = *(key_type *)
                    ((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                            ._M_storage._M_storage + 0x60);
        if (local_68 != (key_type)0x0) {
          pVar7 = std::
                  _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  ::equal_range(&this_00->_M_h,&local_68);
          _Var4._M_cur = (__node_type *)
                         pVar7.first.
                         super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                         ._M_cur;
          while (_Var4._M_cur !=
                 (__node_type *)
                 pVar7.second.
                 super__Node_iterator_base<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                 ._M_cur) {
            if (*(VkRenderPass *)((long)_Var4._M_cur + 0x10) == pVVar1) {
              _Var4._M_cur = (__node_type *)
                             std::
                             _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                             ::erase(&this_00->_M_h,_Var4._M_cur);
            }
            else {
              _Var4._M_cur = *_Var4._M_cur;
            }
          }
        }
        _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                )_Var3._M_cur !=
               __last.
               super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
               ._M_cur);
    }
    std::
    _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::erase(local_38,local_58,__last);
    pthread_mutex_unlock(local_60);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void FramebufferCache::OnDestroyRenderPass(VkRenderPass Pass)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto equal_range = m_RenderPassToKeyMap.equal_range(Pass);
    for (auto it = equal_range.first; it != equal_range.second; ++it)
    {
        const FramebufferCacheKey& Key = it->second;

        auto fb_it = m_Cache.find(Key);
        // Multiple image views may be associated with the same key.
        // The framebuffer is deleted whenever any of the image views or render pass is destroyed
        if (fb_it != m_Cache.end())
        {
            m_DeviceVk.SafeReleaseDeviceObject(std::move(fb_it->second), it->second.CommandQueueMask);
            m_Cache.erase(fb_it);
        }

        // Remove all keys from m_ViewToKeyMap that use the render pass
        auto PurgeViewToKeyMap = [this, Pass](VkImageView vkView) {
            if (vkView == VK_NULL_HANDLE)
                return;
            auto view_it_range = m_ViewToKeyMap.equal_range(vkView);
            for (auto view_it = view_it_range.first; view_it != view_it_range.second;)
            {
                if (view_it->second.Pass == Pass)
                    view_it = m_ViewToKeyMap.erase(view_it);
                else
                    ++view_it;
            }
        };
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            PurgeViewToKeyMap(Key.RTVs[rt]);
        }
        PurgeViewToKeyMap(Key.DSV);
        PurgeViewToKeyMap(Key.ShadingRate);
    }
    m_RenderPassToKeyMap.erase(equal_range.first, equal_range.second);
}